

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_GetAddressByLockingScript_Test::TestBody
          (AddressFactory_GetAddressByLockingScript_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  Script script;
  AddressFactory factory;
  Address *in_stack_ffffffffffffe9e8;
  undefined7 in_stack_ffffffffffffe9f0;
  undefined1 in_stack_ffffffffffffe9f7;
  AddressType *in_stack_ffffffffffffe9f8;
  undefined4 in_stack_ffffffffffffea00;
  undefined4 in_stack_ffffffffffffea04;
  char *in_stack_ffffffffffffea08;
  AssertHelper local_1490;
  Message local_1488;
  string local_1480 [32];
  AssertionResult local_1460;
  AssertHelper local_1450;
  Message local_1448;
  undefined4 local_1440;
  AddressType local_143c;
  AssertionResult local_1438;
  AssertHelper local_1428;
  Message local_1420 [4];
  string local_1400 [32];
  AssertionResult local_13e0;
  AssertHelper local_13d0;
  Message local_13c8;
  Script local_13c0 [6];
  allocator local_1241;
  string local_1240 [32];
  Script local_1220;
  AssertHelper local_11e8;
  Message local_11e0;
  string local_11d8 [32];
  AssertionResult local_11b8;
  AssertHelper local_11a8;
  Message local_11a0;
  undefined4 local_1198;
  AddressType local_1194;
  AssertionResult local_1190;
  AssertHelper local_1180;
  Message local_1178 [4];
  string local_1158 [32];
  AssertionResult local_1138;
  AssertHelper local_1128;
  Message local_1120;
  Script local_1118 [6];
  allocator local_f99;
  string local_f98 [32];
  Script local_f78;
  AssertHelper local_f40;
  Message local_f38;
  string local_f30 [32];
  AssertionResult local_f10;
  AssertHelper local_f00;
  Message local_ef8;
  undefined4 local_ef0;
  AddressType local_eec;
  AssertionResult local_ee8;
  AssertHelper local_ed8;
  Message local_ed0 [4];
  string local_eb0 [32];
  AssertionResult local_e90;
  AssertHelper local_e80;
  Message local_e78;
  Script local_e70 [6];
  allocator local_cf1;
  string local_cf0 [32];
  Script local_cd0;
  AssertHelper local_c98;
  Message local_c90;
  string local_c88 [32];
  AssertionResult local_c68;
  AssertHelper local_c58;
  Message local_c50;
  undefined4 local_c48;
  AddressType local_c44;
  AssertionResult local_c40;
  AssertHelper local_c30;
  Message local_c28 [4];
  string local_c08 [32];
  AssertionResult local_be8;
  AssertHelper local_bd8;
  Message local_bd0;
  Script local_bc8 [6];
  allocator local_a49;
  string local_a48 [32];
  Script local_a28;
  AssertHelper local_9f0;
  Message local_9e8;
  string local_9e0 [32];
  AssertionResult local_9c0;
  AssertHelper local_9b0;
  Message local_9a8;
  undefined4 local_9a0;
  AddressType local_99c;
  AssertionResult local_998;
  AssertHelper local_988;
  Message local_980 [4];
  string local_960 [32];
  AssertionResult local_940;
  AssertHelper local_930;
  Message local_928;
  Script local_920 [6];
  allocator local_7a1;
  string local_7a0 [32];
  Script local_780;
  AssertHelper local_748;
  Message local_740;
  string local_738 [32];
  AssertionResult local_718;
  AssertHelper local_708;
  Message local_700;
  undefined4 local_6f8;
  AddressType local_6f4;
  AssertionResult local_6f0;
  AssertHelper local_6e0;
  Message local_6d8 [4];
  string local_6b8 [32];
  AssertionResult local_698;
  AssertHelper local_688;
  Message local_680;
  Script local_678 [6];
  allocator local_4f9;
  string local_4f8 [32];
  Script local_4d8;
  AssertHelper local_4a0;
  Message local_498;
  string local_490 [32];
  AssertionResult local_470;
  AssertHelper local_460;
  Message local_458;
  undefined4 local_450;
  AddressType local_44c;
  AssertionResult local_448;
  AssertHelper local_438;
  Message local_430 [4];
  string local_410 [32];
  AssertionResult local_3f0;
  AssertHelper local_3e0;
  Message local_3d8 [2];
  Script local_3c8 [6];
  allocator local_249;
  string local_248 [32];
  Script local_228;
  Address local_1f0 [392];
  Script local_68;
  AddressFactory local_30;
  
  cfd::AddressFactory::AddressFactory(&local_30);
  cfd::core::Script::Script(&local_68);
  cfd::core::Address::Address(local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_248,"210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac",
             &local_249);
  cfd::core::Script::Script(&local_228,local_248);
  cfd::core::Script::operator=(&local_68,&local_228);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript(local_3c8);
      cfd::core::Address::operator=(local_1f0,(Address *)local_3c8);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(local_3d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x219,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3e0,local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    testing::Message::~Message((Message *)0x19c1a5);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3f0,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",pcVar3,
             "49a011f97ba520dab063f309bad59daeb30de101");
  std::__cxx11::string::~string(local_410);
  cfd::core::ByteData::~ByteData((ByteData *)0x19c26c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f0);
  if (!bVar1) {
    testing::Message::Message(local_430);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19c312);
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x21a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_438,local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    testing::Message::~Message((Message *)0x19c375);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19c3cd);
  local_44c = cfd::core::Address::GetAddressType(local_1f0);
  local_450 = 2;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,
             (char *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_448);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19c498);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x21b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_460,&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    testing::Message::~Message((Message *)0x19c4fb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19c553);
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_470,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",pcVar3,"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  std::__cxx11::string::~string(local_490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_470);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19c640);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x21c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    testing::Message::~Message((Message *)0x19c6a3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19c6fb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4f8,"76a91449a011f97ba520dab063f309bad59daeb30de10188ac",&local_4f9);
  cfd::core::Script::Script(&local_4d8,local_4f8);
  cfd::core::Script::operator=(&local_68,&local_4d8);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript(local_678);
      cfd::core::Address::operator=(local_1f0,(Address *)local_678);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(&local_680);
    testing::internal::AssertHelper::AssertHelper
              (&local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x21f,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_688,&local_680);
    testing::internal::AssertHelper::~AssertHelper(&local_688);
    testing::Message::~Message((Message *)0x19c94d);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_698,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",pcVar3,
             "49a011f97ba520dab063f309bad59daeb30de101");
  std::__cxx11::string::~string(local_6b8);
  cfd::core::ByteData::~ByteData((ByteData *)0x19ca14);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_698);
  if (!bVar1) {
    testing::Message::Message(local_6d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19caba);
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x220,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6e0,local_6d8);
    testing::internal::AssertHelper::~AssertHelper(&local_6e0);
    testing::Message::~Message((Message *)0x19cb1d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19cb75);
  local_6f4 = cfd::core::Address::GetAddressType(local_1f0);
  local_6f8 = 2;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,
             (char *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6f0);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19cc40);
    testing::internal::AssertHelper::AssertHelper
              (&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x221,pcVar3);
    testing::internal::AssertHelper::operator=(&local_708,&local_700);
    testing::internal::AssertHelper::~AssertHelper(&local_708);
    testing::Message::~Message((Message *)0x19cca3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19ccfb);
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_718,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",pcVar3,"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  std::__cxx11::string::~string(local_738);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_718);
  if (!bVar1) {
    testing::Message::Message(&local_740);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19cde8);
    testing::internal::AssertHelper::AssertHelper
              (&local_748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x222,pcVar3);
    testing::internal::AssertHelper::operator=(&local_748,&local_740);
    testing::internal::AssertHelper::~AssertHelper(&local_748);
    testing::Message::~Message((Message *)0x19ce4b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19cea3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7a0,"a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487",&local_7a1);
  cfd::core::Script::Script(&local_780,local_7a0);
  cfd::core::Script::operator=(&local_68,&local_780);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript(local_920);
      cfd::core::Address::operator=(local_1f0,(Address *)local_920);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(&local_928);
    testing::internal::AssertHelper::AssertHelper
              (&local_930,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x225,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_930,&local_928);
    testing::internal::AssertHelper::~AssertHelper(&local_930);
    testing::Message::~Message((Message *)0x19d0f5);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_940,"address.GetHash().GetHex().c_str()",
             "\"f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4\"",pcVar3,
             "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  std::__cxx11::string::~string(local_960);
  cfd::core::ByteData::~ByteData((ByteData *)0x19d1bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_940);
  if (!bVar1) {
    testing::Message::Message(local_980);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19d262);
    testing::internal::AssertHelper::AssertHelper
              (&local_988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x226,pcVar3);
    testing::internal::AssertHelper::operator=(&local_988,local_980);
    testing::internal::AssertHelper::~AssertHelper(&local_988);
    testing::Message::~Message((Message *)0x19d2c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19d31d);
  local_99c = cfd::core::Address::GetAddressType(local_1f0);
  local_9a0 = 1;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,
             (char *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_998);
  if (!bVar1) {
    testing::Message::Message(&local_9a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19d3e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_9b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x227,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9b0,&local_9a8);
    testing::internal::AssertHelper::~AssertHelper(&local_9b0);
    testing::Message::~Message((Message *)0x19d44b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19d4a3);
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_9c0,"address.GetAddress().c_str()",
             "\"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw\"",pcVar3,"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");
  std::__cxx11::string::~string(local_9e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9c0);
  if (!bVar1) {
    testing::Message::Message(&local_9e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19d590);
    testing::internal::AssertHelper::AssertHelper
              (&local_9f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x228,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9f0,&local_9e8);
    testing::internal::AssertHelper::~AssertHelper(&local_9f0);
    testing::Message::~Message((Message *)0x19d5f3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19d64b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a48,"0014925d4028880bd0c9d68fbc7fc7dfee976698629c",&local_a49);
  cfd::core::Script::Script(&local_a28,local_a48);
  cfd::core::Script::operator=(&local_68,&local_a28);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string(local_a48);
  std::allocator<char>::~allocator((allocator<char> *)&local_a49);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript(local_bc8);
      cfd::core::Address::operator=(local_1f0,(Address *)local_bc8);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(&local_bd0);
    testing::internal::AssertHelper::AssertHelper
              (&local_bd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x22b,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_bd8,&local_bd0);
    testing::internal::AssertHelper::~AssertHelper(&local_bd8);
    testing::Message::~Message((Message *)0x19d89d);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_be8,"address.GetHash().GetHex().c_str()",
             "\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",pcVar3,
             "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  std::__cxx11::string::~string(local_c08);
  cfd::core::ByteData::~ByteData((ByteData *)0x19d964);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_be8);
  if (!bVar1) {
    testing::Message::Message(local_c28);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19da0a);
    testing::internal::AssertHelper::AssertHelper
              (&local_c30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x22c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c30,local_c28);
    testing::internal::AssertHelper::~AssertHelper(&local_c30);
    testing::Message::~Message((Message *)0x19da6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19dac5);
  local_c44 = cfd::core::Address::GetAddressType(local_1f0);
  local_c48 = 4;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,
             (char *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c40);
  if (!bVar1) {
    testing::Message::Message(&local_c50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19db90);
    testing::internal::AssertHelper::AssertHelper
              (&local_c58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x22d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c58,&local_c50);
    testing::internal::AssertHelper::~AssertHelper(&local_c58);
    testing::Message::~Message((Message *)0x19dbf3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19dc4b);
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c68,"address.GetAddress().c_str()",
             "\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\"",pcVar3,
             "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");
  std::__cxx11::string::~string(local_c88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c68);
  if (!bVar1) {
    testing::Message::Message(&local_c90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19dd38);
    testing::internal::AssertHelper::AssertHelper
              (&local_c98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x22e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c98,&local_c90);
    testing::internal::AssertHelper::~AssertHelper(&local_c98);
    testing::Message::~Message((Message *)0x19dd9b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19ddf3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_cf0,"002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",
             &local_cf1);
  cfd::core::Script::Script(&local_cd0,local_cf0);
  cfd::core::Script::operator=(&local_68,&local_cd0);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string(local_cf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript(local_e70);
      cfd::core::Address::operator=(local_1f0,(Address *)local_e70);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(&local_e78);
    testing::internal::AssertHelper::AssertHelper
              (&local_e80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x231,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_e80,&local_e78);
    testing::internal::AssertHelper::~AssertHelper(&local_e80);
    testing::Message::~Message((Message *)0x19e045);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_e90,"address.GetHash().GetHex().c_str()",
             "\"87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437\"",pcVar3,
             "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  std::__cxx11::string::~string(local_eb0);
  cfd::core::ByteData::~ByteData((ByteData *)0x19e10c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e90);
  if (!bVar1) {
    testing::Message::Message(local_ed0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19e1b2);
    testing::internal::AssertHelper::AssertHelper
              (&local_ed8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x232,pcVar3);
    testing::internal::AssertHelper::operator=(&local_ed8,local_ed0);
    testing::internal::AssertHelper::~AssertHelper(&local_ed8);
    testing::Message::~Message((Message *)0x19e215);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19e26d);
  local_eec = cfd::core::Address::GetAddressType(local_1f0);
  local_ef0 = 3;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,
             (char *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ee8);
  if (!bVar1) {
    testing::Message::Message(&local_ef8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19e338);
    testing::internal::AssertHelper::AssertHelper
              (&local_f00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x233,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f00,&local_ef8);
    testing::internal::AssertHelper::~AssertHelper(&local_f00);
    testing::Message::~Message((Message *)0x19e39b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19e3f3);
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_f10,"address.GetAddress().c_str()",
             "\"bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a\"",pcVar3,
             "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  std::__cxx11::string::~string(local_f30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f10);
  if (!bVar1) {
    testing::Message::Message(&local_f38);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19e4da);
    testing::internal::AssertHelper::AssertHelper
              (&local_f40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x234,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f40,&local_f38);
    testing::internal::AssertHelper::~AssertHelper(&local_f40);
    testing::Message::~Message((Message *)0x19e537);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19e58f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f98,"51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
             &local_f99);
  cfd::core::Script::Script(&local_f78,local_f98);
  cfd::core::Script::operator=(&local_68,&local_f78);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string(local_f98);
  std::allocator<char>::~allocator((allocator<char> *)&local_f99);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript(local_1118);
      cfd::core::Address::operator=(local_1f0,(Address *)local_1118);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(&local_1120);
    testing::internal::AssertHelper::AssertHelper
              (&local_1128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x237,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1128,&local_1120);
    testing::internal::AssertHelper::~AssertHelper(&local_1128);
    testing::Message::~Message((Message *)0x19e7cf);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1138,"address.GetHash().GetHex().c_str()",
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",pcVar3,
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  std::__cxx11::string::~string(local_1158);
  cfd::core::ByteData::~ByteData((ByteData *)0x19e896);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1138);
  if (!bVar1) {
    testing::Message::Message(local_1178);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19e936);
    testing::internal::AssertHelper::AssertHelper
              (&local_1180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x238,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1180,local_1178);
    testing::internal::AssertHelper::~AssertHelper(&local_1180);
    testing::Message::~Message((Message *)0x19e993);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19e9eb);
  local_1194 = cfd::core::Address::GetAddressType(local_1f0);
  local_1198 = 7;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,
             (char *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1190);
  if (!bVar1) {
    testing::Message::Message(&local_11a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19eaaa);
    testing::internal::AssertHelper::AssertHelper
              (&local_11a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x239,pcVar3);
    testing::internal::AssertHelper::operator=(&local_11a8,&local_11a0);
    testing::internal::AssertHelper::~AssertHelper(&local_11a8);
    testing::Message::~Message((Message *)0x19eb07);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19eb5f);
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_11b8,"address.GetAddress().c_str()",
             "\"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4\"",pcVar3,
             "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  std::__cxx11::string::~string(local_11d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_11b8);
  if (!bVar1) {
    testing::Message::Message(&local_11e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19ec46);
    testing::internal::AssertHelper::AssertHelper
              (&local_11e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x23a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_11e8,&local_11e0);
    testing::internal::AssertHelper::~AssertHelper(&local_11e8);
    testing::Message::~Message((Message *)0x19eca3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19ecfb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1240,"512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799",
             &local_1241);
  cfd::core::Script::Script(&local_1220,local_1240);
  cfd::core::Script::operator=(&local_68,&local_1220);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string(local_1240);
  std::allocator<char>::~allocator((allocator<char> *)&local_1241);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript(local_13c0);
      cfd::core::Address::operator=(local_1f0,(Address *)local_13c0);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(&local_13c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_13d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x23d,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_13d0,&local_13c8);
    testing::internal::AssertHelper::~AssertHelper(&local_13d0);
    testing::Message::~Message((Message *)0x19ef3b);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_13e0,"address.GetHash().GetHex().c_str()",
             "\"88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799\"",pcVar3,
             "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  std::__cxx11::string::~string(local_1400);
  cfd::core::ByteData::~ByteData((ByteData *)0x19f002);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_13e0);
  if (!bVar1) {
    testing::Message::Message(local_1420);
    in_stack_ffffffffffffea08 =
         testing::AssertionResult::failure_message((AssertionResult *)0x19f0a2);
    testing::internal::AssertHelper::AssertHelper
              (&local_1428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x23e,in_stack_ffffffffffffea08);
    testing::internal::AssertHelper::operator=(&local_1428,local_1420);
    testing::internal::AssertHelper::~AssertHelper(&local_1428);
    testing::Message::~Message((Message *)0x19f0ff);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19f157);
  local_143c = cfd::core::Address::GetAddressType(local_1f0);
  local_1440 = 7;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,(char *)CONCAT44(local_143c,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1438);
  if (!bVar1) {
    testing::Message::Message(&local_1448);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19f216);
    testing::internal::AssertHelper::AssertHelper
              (&local_1450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x23f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1450,&local_1448);
    testing::internal::AssertHelper::~AssertHelper(&local_1450);
    testing::Message::~Message((Message *)0x19f273);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19f2cb);
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1460,"address.GetAddress().c_str()",
             "\"bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah\"",pcVar3,
             "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
  std::__cxx11::string::~string(local_1480);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1460);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_1488);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x19f3b2);
    testing::internal::AssertHelper::AssertHelper
              (&local_1490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x240,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1490,&local_1488);
    testing::internal::AssertHelper::~AssertHelper(&local_1490);
    testing::Message::~Message((Message *)0x19f40d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19f462);
  cfd::core::Address::~Address((Address *)CONCAT17(uVar2,in_stack_ffffffffffffe9f0));
  cfd::core::Script::~Script((Script *)CONCAT17(uVar2,in_stack_ffffffffffffe9f0));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x19f489);
  return;
}

Assistant:

TEST(AddressFactory, GetAddressByLockingScript)
{
  AddressFactory factory;
  Script script;
  Address address;

  script = Script("210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("76a91449a011f97ba520dab063f309bad59daeb30de10188ac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2shAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");

  script = Script("0014925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wpkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");

  script = Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wshAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  
  script = Script("51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  
  script = Script("512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
}